

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262.c
# Opt level: O1

int h262_picparm(bitstream *str,h262_seqparm *seqparm,h262_picparm *picparm)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint in_EAX;
  int iVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint32_t tmp;
  undefined8 uStack_38;
  
  uStack_38._0_4_ = in_EAX;
  iVar3 = vs_u(str,&picparm->temporal_reference,10);
  if (iVar3 == 0) {
    iVar3 = vs_u(str,&picparm->picture_coding_type,3);
    if ((iVar3 == 0) && (iVar3 = vs_u(str,&picparm->vbv_delay,0x10), iVar3 == 0)) {
      uVar5 = picparm->picture_coding_type - 1;
      if (uVar5 < 4) {
        bVar4 = (byte)uVar5 & 0xf;
        if ((9U >> bVar4 & 1) == 0) {
          iVar3 = vs_u(str,&picparm->full_pel_forward_vector,1);
          if (iVar3 != 0) {
            return 1;
          }
          iVar3 = vs_u(str,&picparm->forward_f_code,3);
        }
        else {
          iVar3 = vs_infer(str,&picparm->full_pel_forward_vector,1);
          if (iVar3 != 0) {
            return 1;
          }
          iVar3 = vs_infer(str,&picparm->forward_f_code,7);
        }
        if (iVar3 == 0) {
          if ((0xbU >> bVar4 & 1) == 0) {
            iVar3 = vs_u(str,&picparm->full_pel_backward_vector,1);
            if (iVar3 != 0) {
              return 1;
            }
            iVar3 = vs_u(str,&picparm->backward_f_code,3);
          }
          else {
            iVar3 = vs_infer(str,&picparm->full_pel_backward_vector,1);
            if (iVar3 != 0) {
              return 1;
            }
            iVar3 = vs_infer(str,&picparm->backward_f_code,7);
          }
          if (iVar3 == 0) {
            uStack_38 = (ulong)(uint)uStack_38;
            while (iVar3 = vs_u(str,(uint32_t *)((long)&uStack_38 + 4),1), iVar3 == 0) {
              if (uStack_38._4_4_ == 0) {
                if (str->dir == VS_DECODE) {
                  picparm->is_ext = 0;
                  picparm->has_disp_ext = 0;
                  picparm->load_intra_quantiser_matrix = 0;
                  picparm->load_non_intra_quantiser_matrix = 0;
                  picparm->load_chroma_intra_quantiser_matrix = 0;
                  picparm->load_chroma_non_intra_quantiser_matrix = 0;
                }
                if (picparm->is_ext == 0) {
                  iVar3 = vs_infer(str,picparm->f_code[0],picparm->forward_f_code);
                  if (iVar3 != 0) {
                    return 1;
                  }
                  iVar3 = vs_infer(str,picparm->f_code[0] + 1,picparm->forward_f_code);
                  if (iVar3 != 0) {
                    return 1;
                  }
                  iVar3 = vs_infer(str,picparm->f_code[1],picparm->backward_f_code);
                  if (iVar3 != 0) {
                    return 1;
                  }
                  iVar3 = vs_infer(str,picparm->f_code[1] + 1,picparm->backward_f_code);
                  if (iVar3 != 0) {
                    return 1;
                  }
                  iVar3 = vs_infer(str,&picparm->intra_dc_precision,0);
                  if (iVar3 != 0) {
                    return 1;
                  }
                  iVar3 = vs_infer(str,&picparm->picture_structure,3);
                  if (iVar3 != 0) {
                    return 1;
                  }
                  iVar3 = vs_infer(str,&picparm->top_field_first,0);
                  if (iVar3 != 0) {
                    return 1;
                  }
                  iVar3 = vs_infer(str,&picparm->frame_pred_frame_dct,1);
                  if (iVar3 != 0) {
                    return 1;
                  }
                  iVar3 = vs_infer(str,&picparm->concealment_motion_vectors,0);
                  if (iVar3 != 0) {
                    return 1;
                  }
                  iVar3 = vs_infer(str,&picparm->intra_vlc_format,0);
                  if (iVar3 != 0) {
                    return 1;
                  }
                  iVar3 = vs_infer(str,&picparm->repeat_first_field,0);
                  if (iVar3 != 0) {
                    return 1;
                  }
                  iVar3 = vs_infer(str,&picparm->chroma_420_type,1);
                  if (iVar3 != 0) {
                    return 1;
                  }
                  iVar3 = vs_infer(str,&picparm->progressive_frame,1);
                  if (iVar3 != 0) {
                    return 1;
                  }
                  iVar3 = vs_infer(str,&picparm->composite_display_flag,0);
                  if (iVar3 != 0) {
                    return 1;
                  }
                }
                uVar1 = seqparm->horizontal_size;
                uVar2 = seqparm->vertical_size;
                uVar5 = uVar1 + 0xf >> 4;
                uVar6 = uVar2 + 0xf >> 4;
                picparm->pic_width_in_mbs = uVar5;
                picparm->pic_height_in_mbs = uVar6;
                picparm->pic_size_in_mbs = uVar6 * uVar5;
                return 0;
              }
              iVar3 = vs_u(str,(uint32_t *)((long)&uStack_38 + 4),8);
              if (iVar3 != 0) {
                return 1;
              }
            }
          }
        }
      }
      else {
        h262_picparm_cold_1();
      }
    }
  }
  return 1;
}

Assistant:

int h262_picparm(struct bitstream *str, struct h262_seqparm *seqparm, struct h262_picparm *picparm) {
	int f = 0, b = 0;
	if (vs_u(str, &picparm->temporal_reference, 10)) return 1;
	if (vs_u(str, &picparm->picture_coding_type, 3)) return 1;
	if (vs_u(str, &picparm->vbv_delay, 16)) return 1;
	switch (picparm->picture_coding_type) {
		case H262_PIC_TYPE_I:
			break;
		case H262_PIC_TYPE_P:
			f = 1;
			break;
		case H262_PIC_TYPE_B:
			f = b = 1;
			break;
		case H262_PIC_TYPE_D:
			break;
		default:
			fprintf(stderr, "Invalid picture_coding_type\n");
			return 1;
	}
	if (f) {
		if (vs_u(str, &picparm->full_pel_forward_vector, 1)) return 1;
		if (vs_u(str, &picparm->forward_f_code, 3)) return 1;
	} else {
		if (vs_infer(str, &picparm->full_pel_forward_vector, 1)) return 1;
		if (vs_infer(str, &picparm->forward_f_code, 7)) return 1;
	}
	if (b) {
		if (vs_u(str, &picparm->full_pel_backward_vector, 1)) return 1;
		if (vs_u(str, &picparm->backward_f_code, 3)) return 1;
	} else {
		if (vs_infer(str, &picparm->full_pel_backward_vector, 1)) return 1;
		if (vs_infer(str, &picparm->backward_f_code, 7)) return 1;
	}
	uint32_t tmp = 0;
	while(1) {
		if (vs_u(str, &tmp, 1)) return 1;
		if (!tmp)
			break;
		if (vs_u(str, &tmp, 8)) return 1;
	}
	if (str->dir == VS_DECODE) {
		picparm->is_ext = 0;
		picparm->has_disp_ext = 0;
		picparm->load_intra_quantiser_matrix = 0;
		picparm->load_non_intra_quantiser_matrix = 0;
		picparm->load_chroma_intra_quantiser_matrix = 0;
		picparm->load_chroma_non_intra_quantiser_matrix = 0;
	}
	if (!picparm->is_ext) {
		if (vs_infer(str, &picparm->f_code[0][0], picparm->forward_f_code)) return 1;
		if (vs_infer(str, &picparm->f_code[0][1], picparm->forward_f_code)) return 1;
		if (vs_infer(str, &picparm->f_code[1][0], picparm->backward_f_code)) return 1;
		if (vs_infer(str, &picparm->f_code[1][1], picparm->backward_f_code)) return 1;
		if (vs_infer(str, &picparm->intra_dc_precision, 0)) return 1;
		if (vs_infer(str, &picparm->picture_structure, H262_PIC_STRUCT_FRAME)) return 1;
		if (vs_infer(str, &picparm->top_field_first, 0)) return 1;
		if (vs_infer(str, &picparm->frame_pred_frame_dct, 1)) return 1;
		if (vs_infer(str, &picparm->concealment_motion_vectors, 0)) return 1;
		if (vs_infer(str, &picparm->intra_vlc_format, 0)) return 1;
		if (vs_infer(str, &picparm->repeat_first_field, 0)) return 1;
		if (vs_infer(str, &picparm->chroma_420_type, 1)) return 1;
		if (vs_infer(str, &picparm->progressive_frame, 1)) return 1;
		if (vs_infer(str, &picparm->composite_display_flag, 0)) return 1;
	}
	picparm->pic_width_in_mbs = (seqparm->horizontal_size + 15) / 16;
	picparm->pic_height_in_mbs = (seqparm->vertical_size + 15) / 16;
	picparm->pic_size_in_mbs = picparm->pic_width_in_mbs * picparm->pic_height_in_mbs;
	return 0;
}